

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  CellInfo *in_RDX;
  byte *pbVar1;
  byte *in_RSI;
  MemPage *in_RDI;
  u8 x;
  u8 *pEnd;
  u64 iKey;
  u32 nPayload;
  u8 *pIter;
  bool local_3a;
  ulong local_30;
  uint local_24;
  byte *local_20;
  
  local_24 = (uint)*in_RSI;
  local_20 = in_RSI;
  if (0x7f < local_24) {
    local_24 = local_24 & 0x7f;
    local_20 = in_RSI;
    do {
      pbVar1 = local_20 + 1;
      local_24 = local_24 << 7 | local_20[1] & 0x7f;
      local_3a = 0x7f < *pbVar1 && pbVar1 < in_RSI + 8;
      local_20 = pbVar1;
    } while (local_3a);
  }
  local_30 = (ulong)local_20[1];
  pbVar1 = local_20 + 1;
  if (0x7f < local_30) {
    local_30 = local_30 << 7 ^ (ulong)local_20[2];
    if (local_20[2] < 0x80) {
      local_30 = local_30 ^ 0x4000;
      pbVar1 = local_20 + 2;
    }
    else {
      local_30 = local_30 << 7 ^ (ulong)local_20[3];
      if (local_20[3] < 0x80) {
        local_30 = local_30 ^ 0x204000;
        pbVar1 = local_20 + 3;
      }
      else {
        local_30 = local_30 << 7 ^ 0x10204000 ^ (ulong)local_20[4];
        pbVar1 = local_20 + 4;
        if (0x7f < local_20[4]) {
          local_30 = local_30 << 7 ^ 0x4000 ^ (ulong)local_20[5];
          pbVar1 = local_20 + 5;
          if (0x7f < local_20[5]) {
            local_30 = local_30 << 7 ^ 0x4000 ^ (ulong)local_20[6];
            pbVar1 = local_20 + 6;
            if (0x7f < local_20[6]) {
              local_30 = local_30 << 7 ^ 0x4000 ^ (ulong)local_20[7];
              pbVar1 = local_20 + 7;
              if (0x7f < local_20[7]) {
                local_30 = local_30 << 7 ^ 0x4000 ^ (ulong)local_20[8];
                pbVar1 = local_20 + 8;
                if (0x7f < local_20[8]) {
                  local_30 = local_30 << 8 ^ 0x8000 ^ (ulong)local_20[9];
                  pbVar1 = local_20 + 9;
                }
              }
            }
          }
        }
      }
    }
  }
  local_20 = pbVar1;
  in_RDX->nKey = local_30;
  in_RDX->nPayload = local_24;
  in_RDX->pPayload = local_20 + 1;
  if (in_RDI->maxLocal < local_24) {
    btreeParseCellAdjustSizeForOverflow(in_RDI,in_RSI,in_RDX);
  }
  else {
    in_RDX->nSize = (u16)local_24 + ((short)(local_20 + 1) - (short)in_RSI);
    if (in_RDX->nSize < 4) {
      in_RDX->nSize = 4;
    }
    in_RDX->nLocal = (u16)local_24;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */
  u64 iKey;               /* Extracted Key value */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf );
  assert( pPage->childPtrSize==0 );
  pIter = pCell;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint32(pIter, nPayload);
  **
  ** The code is inlined to avoid a function call.
  */
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( (*pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  **
  ** The code is inlined and the loop is unrolled for performance.
  ** This routine is a high-runner.
  */
  iKey = *pIter;
  if( iKey>=0x80 ){
    u8 x;
    iKey = (iKey<<7) ^ (x = *++pIter);
    if( x>=0x80 ){
      iKey = (iKey<<7) ^ (x = *++pIter);
      if( x>=0x80 ){
        iKey = (iKey<<7) ^ 0x10204000 ^ (x = *++pIter);
        if( x>=0x80 ){
          iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
          if( x>=0x80 ){
            iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
            if( x>=0x80 ){
              iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
              if( x>=0x80 ){
                iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
                if( x>=0x80 ){
                  iKey = (iKey<<8) ^ 0x8000 ^ (*++pIter);
                }
              }
            }
          }
        }
      }else{
        iKey ^= 0x204000;
      }
    }else{
      iKey ^= 0x4000;
    }
  }
  pIter++;

  pInfo->nKey = *(i64*)&iKey;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==(u32)pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}